

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void int8_suite::run(void)

{
  test_zero();
  test_one();
  test_max();
  test_min();
  test_minus_min_plus_one();
  test_minus_one();
  fail_missing_one();
  return;
}

Assistant:

void run()
{
    test_zero();
    test_one();
    test_max();
    test_min();
    test_minus_min_plus_one();
    test_minus_one();
    fail_missing_one();
}